

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant_impl.hpp
# Opt level: O3

void __thiscall
type_safe::detail::
swap_union<type_safe::optional_variant_policy,type_safe::tagged_union<int,double,debugger_type>>::
visitor::operator()(visitor *this,int *param_1,tagged_union<int,_double,_debugger_type> *a,
                   tagged_union<int,_double,_debugger_type> *b)

{
  unsigned_long uVar1;
  undefined4 uVar2;
  undefined1 local_21;
  
  uVar1 = (b->cur_type_).
          super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
          .value_;
  tagged_union<int,_double,_debugger_type>::check<int>(a);
  if (uVar1 == 1) {
    tagged_union<int,_double,_debugger_type>::check<int>(b);
    uVar2 = *(undefined4 *)(a->storage_).storage_;
    *(undefined4 *)(a->storage_).storage_ = *(undefined4 *)(b->storage_).storage_;
  }
  else {
    uVar2 = *(undefined4 *)(a->storage_).storage_;
    with_union<type_safe::detail::move_assign_union_value<type_safe::optional_variant_policy,type_safe::tagged_union<int,double,debugger_type>>::visitor&&,type_safe::tagged_union<int,double,debugger_type>&&,type_safe::union_types<int,double,debugger_type>,type_safe::tagged_union<int,double,debugger_type>&>
    ::with_impl<int,double,debugger_type>(b,&local_21,a);
    destroy_union<type_safe::tagged_union<int,_double,_debugger_type>_>::destroy(b);
    (b->cur_type_).
    super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
    .value_ = 1;
  }
  *(undefined4 *)(b->storage_).storage_ = uVar2;
  return;
}

Assistant:

void operator()(T&, Union& a, Union& b)
            {
                constexpr auto id = typename Union::type_id(union_type<T>{});
                DEBUG_ASSERT(a.type() == id, detail::assert_handler{});

                if (b.type() == id)
                {
                    using std::swap;
                    swap(a.value(union_type<T>{}), b.value(union_type<T>{}));
                }
                else
                {
                    T tmp(std::move(a).value(union_type<T>{})); // save old value from a
                    // assign a to value in b
                    move_assign_union_value<VariantPolicy, Union>::assign(a, std::move(b));
                    // change value in b to tmp
                    VariantPolicy::change_value(union_type<T>{}, b, std::move(tmp));
                }
            }